

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  hostent *phVar3;
  char *pcVar4;
  char *__s2;
  ulong uVar5;
  char *pcVar6;
  addrinfo *ai;
  addrinfo *local_68;
  addrinfo local_60;
  
  if (1 < argc) {
    uVar5 = 1;
    pcVar6 = (char *)0x0;
    do {
      __s2 = argv[uVar5];
      iVar1 = strcmp("--version",__s2);
      if (iVar1 == 0) {
        curl_mprintf("resolve IPv4%s\n","/IPv6");
        return 0;
      }
      iVar1 = strcmp("--ipv6",__s2);
      pcVar4 = "IPv6";
      if (iVar1 == 0) {
LAB_00104b5f:
        use_ipv6 = iVar1 == 0;
        __s2 = pcVar6;
        ipv_inuse = pcVar4;
      }
      else {
        iVar2 = strcmp("--ipv4",__s2);
        pcVar4 = "IPv4";
        if (iVar2 == 0) goto LAB_00104b5f;
      }
      uVar5 = uVar5 + 1;
      pcVar6 = __s2;
    } while ((uint)argc != uVar5);
    if (__s2 != (char *)0x0) {
      if (use_ipv6 == '\0') {
        phVar3 = gethostbyname(__s2);
        if (phVar3 != (hostent *)0x0) {
          return 0;
        }
      }
      else {
        iVar1 = socket(10,2,0);
        if (iVar1 != -1) {
          close(iVar1);
          local_60.ai_addrlen = 0;
          local_60._20_4_ = 0;
          local_60.ai_addr = (sockaddr *)0x0;
          local_60.ai_canonname = (char *)0x0;
          local_60.ai_next = (addrinfo *)0x0;
          local_60.ai_socktype = 1;
          local_60.ai_protocol = 0;
          local_60.ai_flags = 2;
          local_60.ai_family = 10;
          iVar1 = getaddrinfo(__s2,"80",&local_60,&local_68);
          if (iVar1 == 0) {
            freeaddrinfo(local_68);
            return 0;
          }
        }
      }
      curl_mprintf("Resolving %s \'%s\' didn\'t work\n",ipv_inuse,__s2);
      return 1;
    }
  }
  puts("Usage: resolve [option] <host>\n --version\n --ipv4\n --ipv6");
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
  int arg=1;
  const char *host = NULL;
  int rc = 0;

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("resolve IPv4%s\n",
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--ipv6", argv[arg])) {
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
      arg++;
    }
    else if(!strcmp("--ipv4", argv[arg])) {
      /* for completeness, we support this option as well */
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
      arg++;
    }
    else {
      host = argv[arg++];
    }
  }
  if(!host) {
    puts("Usage: resolve [option] <host>\n"
         " --version\n"
         " --ipv4"
#ifdef ENABLE_IPV6
         "\n --ipv6"
#endif
         );
    return 1;
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);
#endif

  if(!use_ipv6) {
    /* gethostbyname() resolve */
    struct hostent *he;

    he = gethostbyname(host);

    rc = !he;
  }
  else {
#ifdef ENABLE_IPV6
    /* Check that the system has IPv6 enabled before checking the resolver */
    curl_socket_t s = socket(PF_INET6, SOCK_DGRAM, 0);
    if(s == CURL_SOCKET_BAD)
      /* an IPv6 address was requested and we can't get/use one */
      rc = -1;
    else {
      sclose(s);
    }

    if(rc == 0) {
      /* getaddrinfo() resolve */
      struct addrinfo *ai;
      struct addrinfo hints;

      memset(&hints, 0, sizeof(hints));
      hints.ai_family = PF_INET6;
      hints.ai_socktype = SOCK_STREAM;
      hints.ai_flags = AI_CANONNAME;
      /* Use parenthesis around functions to stop them from being replaced by
         the macro in memdebug.h */
      rc = (getaddrinfo)(host, "80", &hints, &ai);
      if(rc == 0)
        (freeaddrinfo)(ai);
    }

#else
    puts("IPv6 support has been disabled in this program");
    return 1;
#endif
  }
  if(rc)
    printf("Resolving %s '%s' didn't work\n", ipv_inuse, host);

  return !!rc;
}